

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.cpp
# Opt level: O3

void ZopfliCostModelSetFromLiteralCosts
               (ZopfliCostModel *self,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask)

{
  float fVar1;
  float *pfVar2;
  float *pfVar3;
  size_t len;
  uint uVar4;
  size_t sVar5;
  uint uVar6;
  ulong uVar7;
  double dVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  pfVar2 = self->cost_dist_;
  pfVar3 = self->literal_costs_;
  len = self->num_bytes_;
  duckdb_brotli::BrotliEstimateBitCostsForLiterals
            (position,len,ringbuffer_mask,ringbuffer,(self->field_6).literal_histograms,pfVar3 + 1);
  *pfVar3 = 0.0;
  if (len != 0) {
    sVar5 = 0;
    fVar9 = 0.0;
    fVar10 = 0.0;
    do {
      fVar1 = pfVar3[sVar5 + 1];
      fVar11 = fVar10 + fVar9 + fVar1;
      pfVar3[sVar5 + 1] = fVar11;
      sVar5 = sVar5 + 1;
      fVar9 = (fVar9 + fVar1) - (fVar11 - fVar10);
      fVar10 = fVar11;
    } while (len != sVar5);
  }
  uVar7 = 0;
  do {
    if (uVar7 < 0xf5) {
      dVar8 = (double)(&DAT_013d6118)[uVar7];
    }
    else {
      dVar8 = log2((double)(long)(uVar7 + 0xb));
    }
    self->cost_cmd_[uVar7] = (float)dVar8;
    uVar7 = uVar7 + 1;
  } while (uVar7 != 0x2c0);
  uVar4 = self->distance_histogram_size;
  if (uVar4 != 0) {
    uVar7 = 0;
    do {
      uVar6 = (int)uVar7 + 0x14;
      if (uVar6 < 0x100) {
        dVar8 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar6];
      }
      else {
        dVar8 = log2((double)uVar6);
        uVar4 = self->distance_histogram_size;
      }
      pfVar2[uVar7] = (float)dVar8;
      uVar7 = uVar7 + 1;
    } while (uVar7 < uVar4);
  }
  self->min_cost_cmd_ = 3.4594316;
  return;
}

Assistant:

static void ZopfliCostModelSetFromLiteralCosts(ZopfliCostModel* self,
                                               size_t position,
                                               const uint8_t* ringbuffer,
                                               size_t ringbuffer_mask) {
  float* literal_costs = self->literal_costs_;
  float literal_carry = 0.0;
  float* cost_dist = self->cost_dist_;
  float* cost_cmd = self->cost_cmd_;
  size_t num_bytes = self->num_bytes_;
  size_t i;
  BrotliEstimateBitCostsForLiterals(position, num_bytes, ringbuffer_mask,
                                    ringbuffer, self->literal_histograms,
                                    &literal_costs[1]);
  literal_costs[0] = 0.0;
  for (i = 0; i < num_bytes; ++i) {
    literal_carry += literal_costs[i + 1];
    literal_costs[i + 1] = literal_costs[i] + literal_carry;
    literal_carry -= literal_costs[i + 1] - literal_costs[i];
  }
  for (i = 0; i < BROTLI_NUM_COMMAND_SYMBOLS; ++i) {
    cost_cmd[i] = (float)FastLog2(11 + (uint32_t)i);
  }
  for (i = 0; i < self->distance_histogram_size; ++i) {
    cost_dist[i] = (float)FastLog2(20 + (uint32_t)i);
  }
  self->min_cost_cmd_ = (float)FastLog2(11);
}